

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_freq_substraction.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  _Vector_base<int,_std::allocator<int>_> local_2a8;
  _InputArray local_290;
  arguments_t args;
  Mat image;
  long local_220;
  string local_1d0 [11];
  Mat gauss;
  
  arguments_t::arguments_t(&args,argc,argv);
  sVar1 = arguments_t::parametersSize(&args);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," <input> <output>");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    arguments_t::operator[][abi_cxx11_(local_1d0,&args,0);
    cv::imread((string *)&image,(int)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
    if (local_220 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot open ");
      arguments_t::operator[][abi_cxx11_(local_1d0,&args,0);
      poVar2 = std::operator<<(poVar2,(string *)local_1d0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_1d0);
    }
    else {
      cv::Mat::clone();
      local_1d0[0].field_2._M_allocated_capacity = 0;
      local_290.sz.width = 0;
      local_290.sz.height = 0;
      local_1d0[0]._M_dataplus._M_p._0_4_ = 0x1010000;
      local_290.flags = 0x2010000;
      local_290.obj = &gauss;
      local_1d0[0]._M_string_length = (size_type)&image;
      cv::medianBlur((_InputArray *)local_1d0,(_OutputArray *)&local_290,7);
      cv::operator-((Mat *)local_1d0,&image);
      (**(code **)(*(long *)CONCAT44(local_1d0[0]._M_dataplus._M_p._4_4_,
                                     local_1d0[0]._M_dataplus._M_p._0_4_) + 0x18))
                ((long *)CONCAT44(local_1d0[0]._M_dataplus._M_p._4_4_,
                                  local_1d0[0]._M_dataplus._M_p._0_4_),local_1d0,&image,
                 0xffffffffffffffff);
      cv::MatExpr::~MatExpr((MatExpr *)local_1d0);
      std::__cxx11::string::string((string *)local_1d0,"result",(allocator *)&local_2a8);
      local_290.sz.width = 0;
      local_290.sz.height = 0;
      local_290.flags = 0x1010000;
      local_290.obj = &gauss;
      cv::imshow((string *)local_1d0,&local_290);
      std::__cxx11::string::~string((string *)local_1d0);
      cv::waitKey(0);
      arguments_t::operator[][abi_cxx11_(local_1d0,&args,1);
      local_290.sz.width = 0;
      local_290.sz.height = 0;
      local_290.flags = 0x1010000;
      local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_290.obj = &image;
      cv::imwrite((string *)local_1d0,&local_290,(vector *)&local_2a8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a8);
      std::__cxx11::string::~string((string *)local_1d0);
      cv::Mat::~Mat(&gauss);
    }
    cv::Mat::~Mat(&image);
  }
  arguments_t::~arguments_t(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    arguments_t args(argc, argv);
    if (args.parametersSize() < 2) {
        std::cout << "usage: " << argv[0] << " <input> <output>" << std::endl;
        return 0;
    }

    cv::Mat image = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
    if (!image.data) {
        std::cout << "Cannot open " << args[0] << std::endl;
        return 0;
    }

    auto gauss = image.clone();
    cv::medianBlur(image, gauss, 7);
    image = image - gauss;
    //cv::equalizeHist(image, image);

    cv::imshow("result", gauss);
    cv::waitKey();

    cv::imwrite(args[1], image);
    return 0;
}